

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O3

void __thiscall icu_63::Package::readPackage(Package *this,char *filename)

{
  undefined1 *puVar1;
  UDataSwapper *pUVar2;
  uint8_t inCharset;
  char cVar3;
  int32_t iVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  UDataSwapper *pUVar9;
  char *pcVar10;
  long lVar11;
  Item *pIVar12;
  size_t sVar13;
  FILE *__stream;
  undefined8 extraout_RAX;
  char *pcVar14;
  int32_t in_EDX;
  uint *extraout_RDX;
  uint uVar15;
  uint uVar16;
  Package *this_00;
  Package *__dest;
  UErrorCode __status;
  char *pcVar17;
  uint uVar18;
  char *pcVar19;
  size_t __n;
  uint8_t *puVar20;
  UDataSwapper *pUVar21;
  UErrorCode errorCode;
  char type;
  char prefix [68];
  UErrorCode UStack_53c;
  char acStack_538 [1032];
  Package *pPStack_130;
  size_t sStack_128;
  uint8_t *puStack_120;
  char *pcStack_118;
  Package *pPStack_110;
  Package *pPStack_108;
  UDataSwapper *pUStack_f8;
  char *pcStack_f0;
  UDataSwapper *pUStack_e8;
  Package *pPStack_e0;
  UErrorCode local_d4;
  uint local_d0;
  byte local_c9;
  int32_t *local_c8;
  char *local_c0;
  UDataSwapper *local_b8;
  uint local_ac;
  char *local_a8;
  char *local_a0;
  Package *local_98;
  Package *local_90;
  char *local_88;
  undefined1 *local_80;
  char local_78 [72];
  
  pPStack_e0 = (Package *)0x1e6f6c;
  extractPackageName(filename,this->inPkgName,in_EDX);
  uVar15 = 0;
  pPStack_e0 = (Package *)0x1e6f87;
  puVar8 = readFile((char *)0x0,filename,&this->inLength,(char *)&local_c9);
  this->inData = puVar8;
  uVar18 = this->inLength;
  local_d4 = U_ZERO_ERROR;
  pUVar21 = (UDataSwapper *)(ulong)local_c9;
  if (local_c9 == 0x62) {
    uVar15 = 1;
  }
  else if (local_c9 != 0x6c) {
    uVar15 = (uint)(local_c9 == 0x65) * 4 - 1;
  }
  inCharset = (uint8_t)(uVar15 >> 1);
  this->inCharset = inCharset;
  this->inIsBigEndian = (byte)uVar15 & 1;
  pPStack_e0 = (Package *)0x1e6ffe;
  local_98 = this;
  pUVar9 = udata_openSwapper_63((byte)uVar15 & 1,inCharset,'\0','\0',&local_d4);
  __status = local_d4;
  if (local_d4 < U_ILLEGAL_ARGUMENT_ERROR) {
    local_d0 = (uint)local_c9;
    pUVar9->printError = printPackageError;
    pcVar19 = (char *)(ulong)uVar18;
    uVar15 = 0x400;
    if ((int)uVar18 < 0x400) {
      uVar15 = uVar18;
    }
    pUVar9->printErrorContext = _stderr;
    this->headerLength = uVar15;
    pPStack_e0 = (Package *)0x1e7061;
    local_b8 = pUVar9;
    iVar4 = udata_swapDataHeader_63(pUVar9,this->inData,uVar15,this->header,&local_d4);
    pUVar9 = local_b8;
    this->headerLength = iVar4;
    __status = local_d4;
    if (U_ZERO_ERROR < local_d4) goto LAB_001e7520;
    puVar8 = this->inData;
    if ((((puVar8[0xc] == 'C') && (puVar8[0xd] == 'm')) && (puVar8[0xe] == 'n')) &&
       ((puVar8[0xf] == 'D' && (puVar8[0x10] == '\x01')))) {
      this->inIsBigEndian = puVar8[8];
      this->inCharset = puVar8[9];
      uVar18 = uVar18 - iVar4;
      pcVar19 = (char *)(ulong)uVar18;
      local_a8 = filename;
      if (3 < (int)uVar18) {
        this_00 = (Package *)(long)iVar4;
        local_c0 = (char *)(puVar8 + (long)this_00);
        pPStack_e0 = (Package *)0x1e70fb;
        iVar4 = udata_readInt32_63(local_b8,*(uint32_t *)local_c0);
        this->itemCount = iVar4;
        pPStack_e0 = (Package *)0x1e710c;
        setItemCapacity(this,iVar4);
        iVar7 = this->itemCount;
        if ((long)iVar7 == 0) {
LAB_001e72ea:
          if (this->doAutoPrefix == '\0') goto LAB_001e74c3;
          pPStack_e0 = (Package *)0x1e72fd;
          readPackage();
LAB_001e72fd:
          pPStack_e0 = (Package *)0x1e7305;
          sVar13 = strlen(this->inPkgName);
          iVar7 = (int)sVar13;
          __n = (size_t)iVar7;
          pPStack_e0 = (Package *)0x1e731b;
          memcpy(local_78,this,__n);
          pPStack_e0 = (Package *)0x1e7323;
          sVar13 = strlen(this_00->inPkgName);
          if ((int)sVar13 < iVar7 + 2) {
LAB_001e7348:
            cVar3 = '/';
          }
          else {
            pPStack_e0 = (Package *)0x1e733a;
            iVar6 = bcmp(this_00,this,__n);
            if ((iVar6 != 0) || (cVar3 = '_', this_00->inPkgName[__n] != '_')) goto LAB_001e7348;
          }
          local_78[__n] = cVar3;
          pcVar19 = (char *)(long)(iVar7 + 1);
LAB_001e7355:
          this_00 = (Package *)&this->items;
          local_78[(long)pcVar19] = '\0';
          lVar11 = (long)*local_c8;
          pUVar9 = local_b8;
          puVar20 = puVar8;
          if (0 < lVar11) {
            pcVar14 = local_90->inPkgName;
            pUVar21 = (UDataSwapper *)(puVar8 + (long)(pcVar14 + 8));
            this = (Package *)0x0;
            puVar20 = (uint8_t *)0x0;
            do {
              pPStack_e0 = (Package *)0x1e7393;
              uVar5 = (*pUVar9->readUInt32)
                                (*(uint32_t *)(puVar8 + (long)(pcVar14 + (long)puVar20 * 8 + 4)));
              pcVar10 = local_88 + (int)(uVar5 - (int)local_80);
              pPStack_e0 = (Package *)0x1e73af;
              iVar7 = strncmp(pcVar10,local_78,(size_t)pcVar19);
              pUVar9 = local_b8;
              if ((iVar7 != 0) || (pcVar10[(long)pcVar19] == '\0')) {
                pPStack_e0 = (Package *)0x1e74ea;
                readPackage();
LAB_001e74ea:
                pPStack_e0 = (Package *)0x1e74fd;
                readPackage();
                goto LAB_001e74fd;
              }
              *(char **)(this->inPkgName + (long)*(Item **)this_00) = pcVar10 + (long)pcVar19;
              pPStack_e0 = (Package *)0x1e73d9;
              uVar5 = (*local_b8->readUInt32)
                                (*(uint32_t *)(&pUVar21->inIsBigEndian + (long)puVar20 * 8));
              pIVar12 = *(Item **)this_00;
              *(char **)(this->inPkgName + (long)&pIVar12->data) = local_c0 + uVar5;
              if (this != (Package *)0x0) {
                iVar7 = (int)(local_c0 + uVar5) -
                        (int)*(uint8_t **)(this->inPkgName + (long)&pIVar12[-1].data);
                *(int *)(this->inPkgName + (long)&pIVar12[-1].length) = iVar7;
                pPStack_e0 = (Package *)0x1e7404;
                uVar18 = getTypeEnumForInputData
                                   (*(uint8_t **)(this->inPkgName + (long)&pIVar12[-1].data),iVar7,
                                    &local_d4);
                if (((int)uVar18 < 0) || (U_ZERO_ERROR < local_d4)) goto LAB_001e74ea;
                pIVar12 = *(Item **)this_00;
                this->inPkgName[(long)&pIVar12[-1].type] = "lb?e"[uVar18];
              }
              this->inPkgName[(long)&pIVar12->isDataOwned] = '\0';
              puVar20 = puVar20 + 1;
              lVar11 = (long)*local_c8;
              this = (Package *)(this->inPkgName + 0x18);
            } while ((long)puVar20 < lVar11);
          }
          pPStack_e0 = (Package *)0x1e7456;
          uVar5 = (*pUVar9->readUInt32)(*(uint32_t *)(local_a0 + lVar11 * 8 + -4));
          pIVar12 = *(Item **)this_00;
          lVar11 = (long)*local_c8;
          pcVar14 = (char *)(lVar11 * 3);
          pIVar12[lVar11 + -1].length = local_ac - uVar5;
          pPStack_e0 = (Package *)0x1e747f;
          uVar18 = getTypeEnumForInputData(pIVar12[lVar11 + -1].data,local_ac - uVar5,&local_d4);
          puVar8 = puVar20;
          if ((-1 < (int)uVar18) && (local_d4 < U_ILLEGAL_ARGUMENT_ERROR)) {
            (*(Item **)this_00)[(long)*local_c8 + -1].type = "lb?e"[uVar18];
            if ((byte)local_d0 != 'l') {
              pPStack_e0 = (Package *)0x1e74c3;
              sortItems(local_98);
            }
LAB_001e74c3:
            pPStack_e0 = (Package *)0x1e74cb;
            udata_closeSwapper_63(pUVar9);
            return;
          }
LAB_001e7534:
          pPStack_e0 = (Package *)0x1e7546;
          readPackage();
LAB_001e7546:
          pPStack_e0 = (Package *)0x1e754e;
          readPackage(this_00);
LAB_001e754e:
          pPStack_e0 = (Package *)0x1e7556;
          readPackage(this_00);
LAB_001e7556:
          pcVar17 = (char *)(ulong)(byte)local_d0;
          pPStack_e0 = (Package *)extractPackageName;
          __dest = this_00;
          readPackage();
          pPStack_108 = (Package *)0x1e7573;
          pcVar10 = __dest->inPkgName;
          pUStack_f8 = pUVar9;
          pcStack_f0 = pcVar19;
          pUStack_e8 = pUVar21;
          pPStack_e0 = this;
          pcVar19 = findBasename(pcVar17);
          pPStack_108 = (Package *)0x1e757e;
          sVar13 = strlen(pcVar19);
          uVar18 = (uint)sVar13;
          if ((int)uVar18 < 5) {
LAB_001e75c9:
            pPStack_108 = (Package *)0x1e75d1;
            extractPackageName();
          }
          else {
            this = (Package *)(ulong)(uVar18 - 4);
            pcVar10 = ".dat";
            pPStack_108 = (Package *)0x1e75a0;
            iVar7 = strcmp(pcVar19 + (long)this,".dat");
            if (iVar7 != 0) goto LAB_001e75c9;
            if (uVar18 < 0x44) {
              pPStack_108 = (Package *)0x1e75b8;
              memcpy(__dest,pcVar19,(size_t)this);
              this->inPkgName[(long)__dest->inPkgName] = '\0';
              return;
            }
          }
          pPStack_108 = (Package *)readFile;
          pcVar17 = pcVar19;
          extractPackageName();
          pPStack_130 = __dest;
          sStack_128 = sVar13;
          puStack_120 = puVar8;
          pcStack_118 = pcVar19;
          pPStack_110 = this;
          pPStack_108 = this_00;
          makeFullFilename(pcVar17,pcVar10,acStack_538,(int32_t)pcVar14);
          __stream = fopen(acStack_538,"rb");
          if (__stream == (FILE *)0x0) {
            readFile();
LAB_001e7712:
            readFile();
LAB_001e771f:
            readFile();
          }
          else {
            fseek(__stream,0,2);
            lVar11 = ftell(__stream);
            fseek(__stream,0,0);
            iVar7 = ferror(__stream);
            uVar18 = (uint)lVar11;
            if (((int)uVar18 < 1) || (iVar7 != 0)) goto LAB_001e7712;
            uVar15 = uVar18 + 0xf & 0x7ffffff0;
            *extraout_RDX = uVar15;
            puVar8 = (uint8_t *)uprv_malloc_63((ulong)uVar15);
            if (puVar8 == (uint8_t *)0x0) goto LAB_001e771f;
            sVar13 = fread(puVar8,1,(ulong)(uVar18 & 0x7fffffff),__stream);
            if (uVar18 == (uint)sVar13) {
              iVar7 = *extraout_RDX - uVar18;
              if (iVar7 != 0 && (int)uVar18 <= (int)*extraout_RDX) {
                memset(puVar8 + (uVar18 & 0x7fffffff),0xaa,(long)iVar7);
              }
              fclose(__stream);
              UStack_53c = U_ZERO_ERROR;
              uVar18 = getTypeEnumForInputData(puVar8,*extraout_RDX,&UStack_53c);
              if ((-1 < (int)uVar18) && (UStack_53c < U_ILLEGAL_ARGUMENT_ERROR)) {
                *pcVar14 = "lb?e"[uVar18];
                uprv_free_63((void *)0x0);
                return;
              }
              goto LAB_001e7737;
            }
          }
          readFile();
LAB_001e7737:
          readFile();
          __clang_call_terminate(extraout_RAX);
        }
        if (iVar7 * 8 + 4 <= (int)uVar18) {
          pcVar14 = this_00->inPkgName + 4 + (long)puVar8;
          pPStack_e0 = (Package *)0x1e7143;
          local_a0 = pcVar14;
          uVar5 = (*pUVar9->readUInt32)(*(uint32_t *)(pcVar14 + (long)iVar7 * 8 + -4));
          if ((int)(uVar5 + 0x14) <= (int)uVar18) {
            local_c8 = &this->itemCount;
            uVar15 = *local_c8;
            pUVar21 = (UDataSwapper *)(ulong)uVar15;
            if ((int)uVar15 < 1) goto LAB_001e72ea;
            local_90 = this_00;
            if (this->itemMax < (int)uVar15) {
              pPStack_e0 = (Package *)0x1e752a;
              readPackage((Package *)(ulong)(uint)this->itemMax);
              pUVar2 = pUVar21;
LAB_001e752a:
              pUVar21 = pUVar2;
              pPStack_e0 = (Package *)0x1e752f;
              readPackage();
LAB_001e752f:
              pPStack_e0 = (Package *)0x1e7534;
              readPackage();
              goto LAB_001e7534;
            }
            puVar1 = &((UDataSwapper *)(ulong)(uVar15 * 8))->field_0x4;
            pPStack_e0 = (Package *)0x1e718f;
            uVar5 = (*pUVar9->readUInt32)(*(uint32_t *)(local_c0 + 8));
            pUVar21 = local_b8;
            iVar7 = (int)puVar1;
            uVar16 = uVar5 - iVar7;
            pUVar9 = (UDataSwapper *)(ulong)uVar16;
            if (uVar16 != 0 && iVar7 <= (int)uVar5) {
              pUVar9 = (UDataSwapper *)(ulong)uVar16;
              iVar6 = uVar5 + uVar15 * -8 + -3;
              do {
                if ((local_c0 + (long)puVar1 + -1)[(long)pUVar9] == '\0') goto LAB_001e71ba;
                pUVar9 = (UDataSwapper *)((long)&pUVar9[-1].printErrorContext + 7);
                iVar6 = iVar6 + -1;
              } while (1 < iVar6);
              pUVar9 = (UDataSwapper *)0x0;
            }
LAB_001e71ba:
            iVar6 = (int)pUVar9;
            pcVar14 = local_c0;
            this_00 = (Package *)puVar1;
            pUVar2 = (UDataSwapper *)(ulong)(uVar15 * 8);
            local_ac = uVar18;
            if (100000 < this->inStringTop + iVar6) goto LAB_001e752a;
            pcVar19 = this->inStrings + this->inStringTop;
            pPStack_e0 = (Package *)0x1e7200;
            pcVar14 = pcVar19;
            (*local_b8->swapInvChars)
                      (local_b8,local_c0 + ((ulong)puVar1 & 0xffffffff),iVar6,pcVar19,&local_d4);
            if (U_ZERO_ERROR < local_d4) goto LAB_001e752f;
            this->inStringTop = this->inStringTop + iVar6;
            pPStack_e0 = (Package *)0x1e7232;
            memset(this->items,0,(long)this->itemCount * 0x18);
            pPStack_e0 = (Package *)0x1e723d;
            uVar5 = (*pUVar21->readUInt32)(*(uint32_t *)local_a0);
            this_00 = (Package *)(pcVar19 + (int)(uVar5 - iVar7));
            local_88 = pcVar19;
            local_80 = puVar1;
            if (this->doAutoPrefix == '\0') goto LAB_001e72fd;
            pPStack_e0 = (Package *)0x1e726a;
            pcVar10 = strchr((char *)this_00,0x2f);
            if (pcVar10 == (char *)0x0) goto LAB_001e7546;
            pUVar9 = (UDataSwapper *)(pcVar10 + -(long)this_00);
            iVar7 = (int)pUVar9;
            if ((iVar7 == 0) || (0x3f < iVar7)) goto LAB_001e754e;
            pcVar19 = (char *)((long)pUVar9 << 0x20);
            if ((this->prefixEndsWithType == '\0') ||
               (pcVar14 = (char *)(ulong)local_d0,
               this_00->inPkgName[(long)(pcVar19 + -0x100000000) >> 0x20] == (char)local_d0)) {
              pPStack_e0 = (Package *)0x1e72cd;
              memcpy(this->pkgPrefix,this_00,(long)pcVar19 >> 0x20);
              this->pkgPrefix[(long)pcVar19 >> 0x20] = '\0';
              pcVar19 = (char *)(long)(iVar7 + 1);
              pPStack_e0 = (Package *)0x1e72e8;
              memcpy(local_78,this_00,(size_t)pcVar19);
              goto LAB_001e7355;
            }
            goto LAB_001e7556;
          }
        }
      }
    }
    else {
LAB_001e74fd:
      pPStack_e0 = (Package *)0x1e750b;
      readPackage();
    }
    __status = (UErrorCode)pcVar19;
    pPStack_e0 = (Package *)0x1e7513;
    readPackage((Package *)((ulong)pcVar19 & 0xffffffff));
  }
  pPStack_e0 = (Package *)0x1e7520;
  readPackage();
LAB_001e7520:
  pPStack_e0 = (Package *)0x1e7525;
  exit(__status);
}

Assistant:

void
Package::readPackage(const char *filename) {
    UDataSwapper *ds;
    const UDataInfo *pInfo;
    UErrorCode errorCode;

    const uint8_t *inBytes;

    int32_t length, offset, i;
    int32_t itemLength, typeEnum;
    char type;

    const UDataOffsetTOCEntry *inEntries;

    extractPackageName(filename, inPkgName, (int32_t)sizeof(inPkgName));

    /* read the file */
    inData=readFile(NULL, filename, inLength, type);
    length=inLength;

    /*
     * swap the header - even if the swapping itself is a no-op
     * because it tells us the header length
     */
    errorCode=U_ZERO_ERROR;
    makeTypeProps(type, inCharset, inIsBigEndian);
    ds=udata_openSwapper(inIsBigEndian, inCharset, U_IS_BIG_ENDIAN, U_CHARSET_FAMILY, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                filename, u_errorName(errorCode));
        exit(errorCode);
    }

    ds->printError=printPackageError;
    ds->printErrorContext=stderr;

    headerLength=sizeof(header);
    if(length<headerLength) {
        headerLength=length;
    }
    headerLength=udata_swapDataHeader(ds, inData, headerLength, header, &errorCode);
    if(U_FAILURE(errorCode)) {
        exit(errorCode);
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x43 &&   /* dataFormat="CmnD" */
        pInfo->dataFormat[1]==0x6d &&
        pInfo->dataFormat[2]==0x6e &&
        pInfo->dataFormat[3]==0x44 &&
        pInfo->formatVersion[0]==1
    )) {
        fprintf(stderr, "icupkg: data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as an ICU .dat package\n",
                pInfo->dataFormat[0], pInfo->dataFormat[1],
                pInfo->dataFormat[2], pInfo->dataFormat[3],
                pInfo->formatVersion[0]);
        exit(U_UNSUPPORTED_ERROR);
    }
    inIsBigEndian=(UBool)pInfo->isBigEndian;
    inCharset=pInfo->charsetFamily;

    inBytes=(const uint8_t *)inData+headerLength;
    inEntries=(const UDataOffsetTOCEntry *)(inBytes+4);

    /* check that the itemCount fits, then the ToC table, then at least the header of the last item */
    length-=headerLength;
    if(length<4) {
        /* itemCount does not fit */
        offset=0x7fffffff;
    } else {
        itemCount=udata_readInt32(ds, *(const int32_t *)inBytes);
        setItemCapacity(itemCount); /* resize so there's space */
        if(itemCount==0) {
            offset=4;
        } else if(length<(4+8*itemCount)) {
            /* ToC table does not fit */
            offset=0x7fffffff;
        } else {
            /* offset of the last item plus at least 20 bytes for its header */
            offset=20+(int32_t)ds->readUInt32(inEntries[itemCount-1].dataOffset);
        }
    }
    if(length<offset) {
        fprintf(stderr, "icupkg: too few bytes (%ld after header) for a .dat package\n",
                        (long)length);
        exit(U_INDEX_OUTOFBOUNDS_ERROR);
    }
    /* do not modify the package length variable until the last item's length is set */

    if(itemCount<=0) {
        if(doAutoPrefix) {
            fprintf(stderr, "icupkg: --auto_toc_prefix[_with_type] but the input package is empty\n");
            exit(U_INVALID_FORMAT_ERROR);
        }
    } else {
        char prefix[MAX_PKG_NAME_LENGTH+4];
        char *s, *inItemStrings;

        if(itemCount>itemMax) {
            fprintf(stderr, "icupkg: too many items, maximum is %d\n", itemMax);
            exit(U_BUFFER_OVERFLOW_ERROR);
        }

        /* swap the item name strings */
        int32_t stringsOffset=4+8*itemCount;
        itemLength=(int32_t)(ds->readUInt32(inEntries[0].dataOffset))-stringsOffset;

        // don't include padding bytes at the end of the item names
        while(itemLength>0 && inBytes[stringsOffset+itemLength-1]!=0) {
            --itemLength;
        }

        if((inStringTop+itemLength)>STRING_STORE_SIZE) {
            fprintf(stderr, "icupkg: total length of item name strings too long\n");
            exit(U_BUFFER_OVERFLOW_ERROR);
        }

        inItemStrings=inStrings+inStringTop;
        ds->swapInvChars(ds, inBytes+stringsOffset, itemLength, inItemStrings, &errorCode);
        if(U_FAILURE(errorCode)) {
            fprintf(stderr, "icupkg failed to swap the input .dat package item name strings\n");
            exit(U_INVALID_FORMAT_ERROR);
        }
        inStringTop+=itemLength;

        // reset the Item entries
        memset(items, 0, itemCount*sizeof(Item));

        /*
         * Get the common prefix of the items.
         * New-style ICU .dat packages use tree separators ('/') between package names,
         * tree names, and item names,
         * while old-style ICU .dat packages (before multi-tree support)
         * use an underscore ('_') between package and item names.
         */
        offset=(int32_t)ds->readUInt32(inEntries[0].nameOffset)-stringsOffset;
        s=inItemStrings+offset;  // name of the first entry
        int32_t prefixLength;
        if(doAutoPrefix) {
            // Use the first entry's prefix. Must be a new-style package.
            const char *prefixLimit=strchr(s, U_TREE_ENTRY_SEP_CHAR);
            if(prefixLimit==NULL) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix[_with_type] but "
                        "the first entry \"%s\" does not contain a '%c'\n",
                        s, U_TREE_ENTRY_SEP_CHAR);
                exit(U_INVALID_FORMAT_ERROR);
            }
            prefixLength=(int32_t)(prefixLimit-s);
            if(prefixLength==0 || prefixLength>=UPRV_LENGTHOF(pkgPrefix)) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix[_with_type] but "
                        "the prefix of the first entry \"%s\" is empty or too long\n",
                        s);
                exit(U_INVALID_FORMAT_ERROR);
            }
            if(prefixEndsWithType && s[prefixLength-1]!=type) {
                fprintf(stderr,
                        "icupkg: --auto_toc_prefix_with_type but "
                        "the prefix of the first entry \"%s\" does not end with '%c'\n",
                        s, type);
                exit(U_INVALID_FORMAT_ERROR);
            }
            memcpy(pkgPrefix, s, prefixLength);
            pkgPrefix[prefixLength]=0;
            memcpy(prefix, s, ++prefixLength);  // include the /
        } else {
            // Use the package basename as prefix.
            int32_t inPkgNameLength= static_cast<int32_t>(strlen(inPkgName));
            memcpy(prefix, inPkgName, inPkgNameLength);
            prefixLength=inPkgNameLength;

            if( (int32_t)strlen(s)>=(inPkgNameLength+2) &&
                0==memcmp(s, inPkgName, inPkgNameLength) &&
                s[inPkgNameLength]=='_'
            ) {
                // old-style .dat package
                prefix[prefixLength++]='_';
            } else {
                // new-style .dat package
                prefix[prefixLength++]=U_TREE_ENTRY_SEP_CHAR;
                // if it turns out to not contain U_TREE_ENTRY_SEP_CHAR
                // then the test in the loop below will fail
            }
        }
        prefix[prefixLength]=0;

        /* read the ToC table */
        for(i=0; i<itemCount; ++i) {
            // skip the package part of the item name, error if it does not match the actual package name
            // or if nothing follows the package name
            offset=(int32_t)ds->readUInt32(inEntries[i].nameOffset)-stringsOffset;
            s=inItemStrings+offset;
            if(0!=strncmp(s, prefix, prefixLength) || s[prefixLength]==0) {
                fprintf(stderr, "icupkg: input .dat item name \"%s\" does not start with \"%s\"\n",
                        s, prefix);
                exit(U_INVALID_FORMAT_ERROR);
            }
            items[i].name=s+prefixLength;

            // set the item's data
            items[i].data=(uint8_t *)inBytes+ds->readUInt32(inEntries[i].dataOffset);
            if(i>0) {
                items[i-1].length=(int32_t)(items[i].data-items[i-1].data);

                // set the previous item's platform type
                typeEnum=getTypeEnumForInputData(items[i-1].data, items[i-1].length, &errorCode);
                if(typeEnum<0 || U_FAILURE(errorCode)) {
                    fprintf(stderr, "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n", items[i-1].name, filename);
                    exit(U_INVALID_FORMAT_ERROR);
                }
                items[i-1].type=makeTypeLetter(typeEnum);
            }
            items[i].isDataOwned=FALSE;
        }
        // set the last item's length
        items[itemCount-1].length=length-ds->readUInt32(inEntries[itemCount-1].dataOffset);

        // set the last item's platform type
        typeEnum=getTypeEnumForInputData(items[itemCount-1].data, items[itemCount-1].length, &errorCode);
        if(typeEnum<0 || U_FAILURE(errorCode)) {
            fprintf(stderr, "icupkg: not an ICU data file: item \"%s\" in \"%s\"\n", items[itemCount-1].name, filename);
            exit(U_INVALID_FORMAT_ERROR);
        }
        items[itemCount-1].type=makeTypeLetter(typeEnum);

        if(type!=U_ICUDATA_TYPE_LETTER[0]) {
            // sort the item names for the local charset
            sortItems();
        }
    }

    udata_closeSwapper(ds);
}